

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

TCGv_i64 new_tmp_a64_aarch64(DisasContext_conflict1 *s)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  TCGTemp *pTVar2;
  TCGv_i64 pTVar3;
  
  if (s->tmp_a64_count < 0x10) {
    s_00 = s->uc->tcg_ctx;
    pTVar2 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    pTVar3 = (TCGv_i64)((long)pTVar2 - (long)s_00);
    iVar1 = s->tmp_a64_count;
    s->tmp_a64_count = iVar1 + 1;
    s->tmp_a64[iVar1] = pTVar3;
    return pTVar3;
  }
  __assert_fail("s->tmp_a64_count < TMP_A64_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x185,"TCGv_i64 new_tmp_a64_aarch64(DisasContext *)");
}

Assistant:

TCGv_i64 new_tmp_a64(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    assert(s->tmp_a64_count < TMP_A64_MAX);
    return s->tmp_a64[s->tmp_a64_count++] = tcg_temp_new_i64(tcg_ctx);
}